

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

void Persistent_Test_Hitter<8u>(string *PATH)

{
  __node_base *p_Var1;
  _Hash_node_base *p_Var2;
  char cVar3;
  __node_base _Var4;
  undefined8 *puVar5;
  uint64_t uVar6;
  value_type *__val;
  void *pvVar7;
  long *plVar8;
  WavingSketch<8U,_16U,_8U> *pWVar9;
  Small_Space<8U> *this;
  PIE<8U> *this_00;
  OO_FPI<8U> *this_01;
  ostream *poVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  long *plVar13;
  __hashtable_alloc *p_Var14;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  undefined8 *puVar15;
  undefined8 *puVar16;
  uint uVar17;
  uint32_t j;
  long lVar18;
  ulong uVar19;
  int cnt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  HashMap<8U> mp;
  string file;
  Data<8U> packet;
  Abstract<8U> *sketch [4];
  ofstream out;
  uint local_374;
  _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_370;
  undefined8 *local_338;
  undefined8 *puStack_330;
  undefined8 *local_328;
  _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_320;
  uint64_t local_2e8;
  long *local_2e0 [2];
  long local_2d0 [2];
  long local_2c0;
  Data<8U> *local_2b8;
  key_type local_2b0;
  WavingSketch<8U,_16U,_8U> *local_2a8;
  Small_Space<8U> *local_2a0;
  PIE<8U> *local_298;
  OO_FPI<8U> *local_290;
  undefined8 local_280;
  __hashtable_alloc *local_278;
  undefined8 *local_270;
  _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_268;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_Data<8U>,_int>,_true>_>_>
  local_230;
  long local_228;
  long local_220;
  long lStack_218;
  ios_base local_138 [264];
  
  local_338 = (undefined8 *)0x0;
  puStack_330 = (undefined8 *)0x0;
  local_328 = (undefined8 *)0x0;
  local_338 = (undefined8 *)operator_new(0x20);
  puStack_330 = local_338 + 4;
  *local_338 = 0;
  local_338[1] = 0;
  local_338[2] = 0;
  local_338[3] = 0;
  local_2e0[0] = local_2d0;
  local_328 = puStack_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"caida","");
  pvVar7 = operator_new(0x200);
  local_370._M_buckets = &local_370._M_before_begin._M_nxt;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_370,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_370);
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_2e0[0]);
  p_Var1 = &local_320._M_before_begin;
  plVar13 = plVar8 + 2;
  if ((__node_base *)*plVar8 == (__node_base *)plVar13) {
    local_320._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_320._M_element_count = plVar8[3];
    local_320._M_buckets = &p_Var1->_M_nxt;
  }
  else {
    local_320._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_320._M_buckets = (__buckets_ptr)*plVar8;
  }
  local_320._M_bucket_count = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_320);
  p_Var14 = (__hashtable_alloc *)(plVar8 + 2);
  if ((__hashtable_alloc *)*plVar8 == p_Var14) {
    local_220 = *(long *)p_Var14;
    lStack_218 = plVar8[3];
    local_230._M_h = (__hashtable_alloc *)&local_220;
  }
  else {
    local_220 = *(long *)p_Var14;
    local_230._M_h = (__hashtable_alloc *)*plVar8;
  }
  local_228 = plVar8[1];
  *plVar8 = (long)p_Var14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::ofstream::ofstream(pvVar7,(string *)&local_230,_S_out);
  *local_338 = pvVar7;
  if (local_230._M_h != (__hashtable_alloc *)&local_220) {
    operator_delete(local_230._M_h,local_220 + 1);
  }
  if ((__node_base *)local_320._M_buckets != p_Var1) {
    operator_delete(local_320._M_buckets,
                    (ulong)((long)&(local_320._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((__node_base *)local_370._M_buckets != &local_370._M_before_begin) {
    operator_delete(local_370._M_buckets,
                    (ulong)((long)&(local_370._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  pvVar7 = operator_new(0x200);
  local_370._M_buckets = &local_370._M_before_begin._M_nxt;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_370,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_370);
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_2e0[0]);
  plVar13 = plVar8 + 2;
  if ((__node_base *)*plVar8 == (__node_base *)plVar13) {
    local_320._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_320._M_element_count = plVar8[3];
    local_320._M_buckets = &p_Var1->_M_nxt;
  }
  else {
    local_320._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_320._M_buckets = (__buckets_ptr)*plVar8;
  }
  local_320._M_bucket_count = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_320);
  p_Var14 = (__hashtable_alloc *)(plVar8 + 2);
  if ((__hashtable_alloc *)*plVar8 == p_Var14) {
    local_220 = *(long *)p_Var14;
    lStack_218 = plVar8[3];
    local_230._M_h = (__hashtable_alloc *)&local_220;
  }
  else {
    local_220 = *(long *)p_Var14;
    local_230._M_h = (__hashtable_alloc *)*plVar8;
  }
  local_228 = plVar8[1];
  *plVar8 = (long)p_Var14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::ofstream::ofstream(pvVar7,(string *)&local_230,_S_out);
  local_338[1] = pvVar7;
  if (local_230._M_h != (__hashtable_alloc *)&local_220) {
    operator_delete(local_230._M_h,local_220 + 1);
  }
  if ((__node_base *)local_320._M_buckets != p_Var1) {
    operator_delete(local_320._M_buckets,
                    (ulong)((long)&(local_320._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((__node_base *)local_370._M_buckets != &local_370._M_before_begin) {
    operator_delete(local_370._M_buckets,
                    (ulong)((long)&(local_370._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  pvVar7 = operator_new(0x200);
  local_370._M_buckets = &local_370._M_before_begin._M_nxt;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_370,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_370);
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_2e0[0]);
  plVar13 = plVar8 + 2;
  if ((__node_base *)*plVar8 == (__node_base *)plVar13) {
    local_320._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_320._M_element_count = plVar8[3];
    local_320._M_buckets = &p_Var1->_M_nxt;
  }
  else {
    local_320._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_320._M_buckets = (__buckets_ptr)*plVar8;
  }
  local_320._M_bucket_count = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_320);
  p_Var14 = (__hashtable_alloc *)(plVar8 + 2);
  if ((__hashtable_alloc *)*plVar8 == p_Var14) {
    local_220 = *(long *)p_Var14;
    lStack_218 = plVar8[3];
    local_230._M_h = (__hashtable_alloc *)&local_220;
  }
  else {
    local_220 = *(long *)p_Var14;
    local_230._M_h = (__hashtable_alloc *)*plVar8;
  }
  local_228 = plVar8[1];
  *plVar8 = (long)p_Var14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::ofstream::ofstream(pvVar7,(string *)&local_230,_S_out);
  local_338[2] = pvVar7;
  if (local_230._M_h != (__hashtable_alloc *)&local_220) {
    operator_delete(local_230._M_h,local_220 + 1);
  }
  if ((__node_base *)local_320._M_buckets != p_Var1) {
    operator_delete(local_320._M_buckets,
                    (ulong)((long)&(local_320._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((__node_base *)local_370._M_buckets != &local_370._M_before_begin) {
    operator_delete(local_370._M_buckets,
                    (ulong)((long)&(local_370._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  pvVar7 = operator_new(0x200);
  local_370._M_buckets = &local_370._M_before_begin._M_nxt;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_370,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_370);
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_2e0[0]);
  plVar13 = plVar8 + 2;
  if ((__node_base *)*plVar8 == (__node_base *)plVar13) {
    local_320._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_320._M_element_count = plVar8[3];
    local_320._M_buckets = &p_Var1->_M_nxt;
  }
  else {
    local_320._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_320._M_buckets = (__buckets_ptr)*plVar8;
  }
  local_320._M_bucket_count = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_320);
  p_Var14 = (__hashtable_alloc *)(plVar8 + 2);
  if ((__hashtable_alloc *)*plVar8 == p_Var14) {
    local_220 = *(long *)p_Var14;
    lStack_218 = plVar8[3];
    local_230._M_h = (__hashtable_alloc *)&local_220;
  }
  else {
    local_220 = *(long *)p_Var14;
    local_230._M_h = (__hashtable_alloc *)*plVar8;
  }
  local_228 = plVar8[1];
  *plVar8 = (long)p_Var14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::ofstream::ofstream(pvVar7,(string *)&local_230,_S_out);
  local_338[3] = pvVar7;
  if (local_230._M_h != (__hashtable_alloc *)&local_220) {
    operator_delete(local_230._M_h,local_220 + 1);
  }
  if ((__node_base *)local_320._M_buckets != p_Var1) {
    operator_delete(local_320._M_buckets,
                    (ulong)((long)&(local_320._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((__node_base *)local_370._M_buckets != &local_370._M_before_begin) {
    operator_delete(local_370._M_buckets,
                    (ulong)((long)&(local_370._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  local_2b8 = read_standard_data<8u>((PATH->_M_dataplus)._M_p,record_length,(int *)&local_374);
  uVar17 = 10000000;
  if ((int)local_374 < 10000000) {
    uVar17 = local_374;
  }
  local_278 = _VTT;
  local_280 = _log;
  lVar18 = 0;
  local_374 = uVar17;
  do {
    uVar19 = (lVar18 * 8 + 8) * 5;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",uVar19 & 0xffffffff);
    pWVar9 = (WavingSketch<8U,_16U,_8U> *)operator_new(0xa8);
    local_2c0 = lVar18 + 1;
    local_2e8 = local_2c0 * 40000;
    WavingSketch<8U,_16U,_8U>::WavingSketch(pWVar9,(int)local_2e8,0xf3,3);
    local_2a8 = pWVar9;
    this = (Small_Space<8U> *)operator_new(0xb0);
    Small_Space<8U>::Small_Space(this,(int)local_2e8,0xf3);
    local_2a0 = this;
    this_00 = (PIE<8U> *)operator_new(0x80);
    PIE<8U>::PIE(this_00,(int)local_2c0 * 8000000,0xf3,0x640);
    local_298 = this_00;
    this_01 = (OO_FPI<8U> *)operator_new(0x98);
    OO_FPI<8U>::OO_FPI(this_01,local_2e8,0xf3);
    local_290 = this_01;
    puVar16 = local_338;
    puVar5 = puStack_330;
    if ((lVar18 == 0) && (local_270 = puStack_330, puVar15 = local_338, local_338 != puStack_330)) {
      do {
        poVar10 = (ostream *)*puVar15;
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"MEM(KB)",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
        lVar18 = 0;
        do {
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)*puVar15,
                               ((&local_2a8)[lVar18]->super_Abstract<8U>).name._M_dataplus._M_p,
                               ((&local_2a8)[lVar18]->super_Abstract<8U>).name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 4);
        cVar3 = (char)(long *)*puVar15;
        std::ios::widen((char)*(undefined8 *)(*(long *)*puVar15 + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        puVar15 = puVar15 + 1;
        puVar16 = local_338;
        puVar5 = puStack_330;
      } while (puVar15 != local_270);
    }
    for (; puVar16 != puVar5; puVar16 = puVar16 + 1) {
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)*puVar16,(int)uVar19);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
    }
    local_320._M_buckets = &local_320._M_single_bucket;
    local_320._M_bucket_count = 1;
    local_320._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_320._M_element_count = 0;
    local_320._M_rehash_policy._M_max_load_factor = 1.0;
    local_320._M_rehash_policy._M_next_resize = 0;
    local_320._M_single_bucket = (__node_base_ptr)0x0;
    local_370._M_buckets = &local_370._M_single_bucket;
    local_370._M_bucket_count = 1;
    local_370._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_370._M_element_count = 0;
    local_370._M_rehash_policy._M_max_load_factor = 1.0;
    local_370._M_rehash_policy._M_next_resize = 0;
    local_370._M_single_bucket = (__node_base_ptr)0x0;
    local_2b0.str[0] = '\0';
    local_2b0.str[1] = '\0';
    local_2b0.str[2] = '\0';
    local_2b0.str[3] = '\0';
    local_2b0.str[4] = '\0';
    local_2b0.str[5] = '\0';
    local_2b0.str[6] = '\0';
    local_2b0.str[7] = '\0';
    if (local_374 != 0) {
      uVar19 = 0;
      uVar17 = 0;
      do {
        local_2b0.str = *&local_2b8[uVar19].str;
        _Var4._M_nxt = local_370._M_before_begin._M_nxt;
        if ((uint)((int)uVar19 * -0x36b834f) < 0x35abe) {
          while (_Var4._M_nxt != (_Hash_node_base *)0x0) {
            p_Var2 = (_Var4._M_nxt)->_M_nxt;
            operator_delete(_Var4._M_nxt,0x20);
            _Var4._M_nxt = p_Var2;
          }
          uVar17 = uVar17 + 1;
          memset(local_370._M_buckets,0,local_370._M_bucket_count << 3);
          local_370._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_370._M_element_count = 0;
        }
        iVar11 = std::
                 _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&local_320,&local_2b0);
        if (iVar11.super__Node_iterator_base<std::pair<const_Data<8U>,_int>,_true>._M_cur ==
            (__node_type *)0x0) {
          pmVar12 = std::__detail::
                    _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&local_320,&local_2b0);
          *pmVar12 = 1;
          pmVar12 = std::__detail::
                    _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&local_370,&local_2b0);
          *pmVar12 = 1;
        }
        else {
          iVar11 = std::
                   _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&local_370,&local_2b0);
          if (iVar11.super__Node_iterator_base<std::pair<const_Data<8U>,_int>,_true>._M_cur ==
              (__node_type *)0x0) {
            pmVar12 = std::__detail::
                      _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&local_370,&local_2b0);
            *pmVar12 = 1;
            pmVar12 = std::__detail::
                      _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&local_320,&local_2b0);
            *pmVar12 = *pmVar12 + 1;
          }
        }
        uVar19 = uVar19 + 1;
        lVar18 = 0;
        do {
          (*((&local_2a8)[lVar18]->super_Abstract<8U>)._vptr_Abstract[7])
                    ((&local_2a8)[lVar18],&local_2b0,(ulong)uVar17);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 4);
      } while (uVar19 < local_374);
    }
    lVar18 = 0;
    do {
      pWVar9 = (&local_2a8)[lVar18];
      local_268._M_buckets = (__buckets_ptr)0x0;
      local_268._M_bucket_count = local_320._M_bucket_count;
      local_268._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_268._M_element_count = local_320._M_element_count;
      local_268._M_rehash_policy._4_4_ = local_320._M_rehash_policy._4_4_;
      local_268._M_rehash_policy._M_max_load_factor = local_320._M_rehash_policy._M_max_load_factor;
      local_268._M_rehash_policy._M_next_resize = local_320._M_rehash_policy._M_next_resize;
      local_268._M_single_bucket = (__node_base_ptr)0x0;
      local_230._M_h = (__hashtable_alloc *)&local_268;
      std::
      _Hashtable<Data<8u>,std::pair<Data<8u>const,int>,std::allocator<std::pair<Data<8u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<8u>>,My_Hash<8u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<Data<8u>,std::pair<Data<8u>const,int>,std::allocator<std::pair<Data<8u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<8u>>,My_Hash<8u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Data<8u>const,int>,true>>>>
                ((_Hashtable<Data<8u>,std::pair<Data<8u>const,int>,std::allocator<std::pair<Data<8u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<8u>>,My_Hash<8u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_268,&local_320,&local_230);
      (*(pWVar9->super_Abstract<8U>)._vptr_Abstract[6])(pWVar9,&local_268,&local_338);
      std::
      _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_268);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 4);
    std::ofstream::ofstream(&local_230);
    uVar6 = local_2e8;
    lVar18 = 0;
    do {
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      Abstract<8U>::print_f1
                (&(&local_2a8)[lVar18]->super_Abstract<8U>,(ofstream *)&local_230,(int)uVar6);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 4);
    lVar18 = 0;
    do {
      if ((&local_2a8)[lVar18] != (WavingSketch<8U,_16U,_8U> *)0x0) {
        (*((&local_2a8)[lVar18]->super_Abstract<8U>)._vptr_Abstract[9])();
      }
      puVar5 = puStack_330;
      lVar18 = lVar18 + 1;
      puVar16 = local_338;
    } while (lVar18 != 4);
    for (; puVar16 != puVar5; puVar16 = puVar16 + 1) {
      cVar3 = (char)(long *)*puVar16;
      std::ios::widen((char)*(undefined8 *)(*(long *)*puVar16 + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
    }
    local_230._M_h = local_278;
    *(undefined8 *)((long)&local_230._M_h + *(long *)(local_278 + -0x18)) = local_280;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
    std::
    _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_370);
    std::
    _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_320);
    lVar18 = local_2c0;
  } while (local_2c0 != 5);
  free(local_2b8);
  if (local_2e0[0] != local_2d0) {
    operator_delete(local_2e0[0],local_2d0[0] + 1);
  }
  if (local_338 != (undefined8 *)0x0) {
    operator_delete(local_338,(long)local_328 - (long)local_338);
  }
  return;
}

Assistant:

void Persistent_Test_Hitter(string PATH) {
	std::vector<std::ostream*> outs(4);
	std::string file = "caida";
	outs[0] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_Recall Rate (RR).csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_Precision Rate (PR).csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_F1.csv");
	outs[3] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_ARE.csv");
	int cnt;
	auto records = read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
	cnt = std::min(cnt, MAX_PACKET);
	for (int i = 0; i < 5; ++i) {
		constexpr int SKETCH_NUM = 4;
		int memory = Persistent_BLOCK * (i + 1);
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m", memory / 1000);
		Abstract<DATA_LEN>* sketch[SKETCH_NUM];
		sketch[0] = new WavingSketch<8, 16, DATA_LEN>(memory, Persistent_HIT);
		sketch[1] = new Small_Space<DATA_LEN>(memory, Persistent_HIT);
		sketch[2] = new PIE<DATA_LEN>(memory * 200, Persistent_HIT, 1600);
		sketch[3] = new OO_FPI<DATA_LEN>(memory, Persistent_HIT);
		if (i == 0)
		{
			for (auto& out : outs)
			{
				*out << "MEM(KB)" << ",";
				for (uint32_t j = 0; j < SKETCH_NUM; j++)
				{
					*out << sketch[j]->name << ",";
				}
				*out << std::endl;
			}
		}
		for (auto& out : outs)
		{
			*out << memory / 1000 << ",";
		}
		HashMap<DATA_LEN> mp;
		HashMap<DATA_LEN> cycle;
		Data<DATA_LEN> packet;
		uint num = 0;
		uint time = 0;
		// int t;

		while (num < cnt) {
			packet = records[num];
			if (num % 19537 == 0) {
				time += 1;
				cycle.clear();
			}
			num++;

			if (mp.find(packet) == mp.end()) {
				mp[packet] = 1;
				cycle[packet] = 1;
			}
			else if (cycle.find(packet) == cycle.end()) {
				cycle[packet] = 1;
				mp[packet] += 1;
			}

			for (int j = 0; j < SKETCH_NUM; ++j) {
				sketch[j]->Init(packet, time);
			}
		}

		for (int j = 0; j < SKETCH_NUM; ++j) {
			sketch[j]->Check(mp, outs);
		}

		ofstream out;

		for (int j = 0; j < SKETCH_NUM; ++j) {
			printf("\033[0m\033[1;36m|\033[0m\t");
			sketch[j]->print_f1(out, memory);
		}

		for (int j = 0; j < SKETCH_NUM; ++j) {
			delete sketch[j];
		}
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}
	free(records);
}